

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getSamplePos
          (ImageSampleInstanceImages *this,VkImageViewType viewType,deUint32 baseMipLevel,
          deUint32 baseArraySlice,int samplePosNdx)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 uVar7;
  ulong in_XMM1_Qa;
  Vec4 VVar8;
  float local_bc;
  uint local_a8 [2];
  deUint32 slices_1 [4];
  Vec3 coords_1 [4];
  deUint32 slices [4];
  Vec3 coords [4];
  deUint32 arraySize;
  deUint32 imageSize;
  int samplePosNdx_local;
  deUint32 baseArraySlice_local;
  deUint32 baseMipLevel_local;
  VkImageViewType viewType_local;
  
  coords[3].m_data[2] = (float)(0x40 >> ((byte)baseMipLevel & 0x1f));
  bVar1 = isImageViewTypeArray(viewType);
  if (bVar1) {
    local_bc = (float)(2 - baseArraySlice);
  }
  else {
    local_bc = 1.4013e-45;
  }
  coords[3].m_data[1] = local_bc;
  if (viewType < VK_IMAGE_VIEW_TYPE_CUBE) {
LAB_00a127e3:
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(slices + 2),0.75,0.5,
               (float)(int)(0xc % (ulong)(uint)coords[3].m_data[2]) + 0.25);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords[0].m_data + 1),
               (float)(int)(0x17 % (ulong)(uint)coords[3].m_data[2]) + 0.25,
               (float)(int)(0x49 % (ulong)(uint)coords[3].m_data[2]) + 0.5,
               (float)(int)(0x10 % (ulong)(uint)coords[3].m_data[2]) + 0.5 +
               (float)(uint)coords[3].m_data[2]);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords[1].m_data + 1),
               0.25 - (float)(int)(0x2b % (ulong)(uint)coords[3].m_data[2]),
               (float)(int)(0x54 % (ulong)(uint)coords[3].m_data[2]) + 0.5 +
               (float)(uint)coords[3].m_data[2],
               (float)(int)(0x75 % (ulong)(uint)coords[3].m_data[2]) + 0.75);
    fVar4 = (float)(int)(0x4b % (ulong)(uint)coords[3].m_data[2]) + 0.25;
    in_XMM1_Qa = (ulong)(uint)fVar4;
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords[2].m_data + 1),(float)(uint)coords[3].m_data[2] + 0.5,
               fVar4,(float)(int)(0x53 % (ulong)(uint)coords[3].m_data[2]) + 0.25 +
                     (float)(uint)coords[3].m_data[2]);
    coords_1[3].m_data[1] = (float)(0 % (ulong)(uint)coords[3].m_data[1]);
    coords_1[3].m_data[2] = (float)(4 % (ulong)(uint)coords[3].m_data[1]);
    slices[0] = (deUint32)(9 % (ulong)(uint)coords[3].m_data[1]);
    slices[1] = (deUint32)(2 % (ulong)(uint)coords[3].m_data[1]);
    if ((viewType == VK_IMAGE_VIEW_TYPE_1D) || (viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)) {
      fVar4 = tcu::Vector<float,_3>::x
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      in_XMM1_Qa = CONCAT44((int)(in_XMM1_Qa >> 0x20),(float)slices[(long)samplePosNdx + -2]);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)this,fVar4 / (float)(uint)coords[3].m_data[2],
                 (float)slices[(long)samplePosNdx + -2],0.0,0.0);
      uVar7 = extraout_XMM0_Qa;
    }
    else if ((viewType == VK_IMAGE_VIEW_TYPE_2D) || (viewType == VK_IMAGE_VIEW_TYPE_2D_ARRAY)) {
      fVar4 = tcu::Vector<float,_3>::x
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      uVar2 = (ulong)(uint)coords[3].m_data[2];
      fVar5 = tcu::Vector<float,_3>::y
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      in_XMM1_Qa = CONCAT44(extraout_XMM0_Db,fVar5 / (float)(uint)coords[3].m_data[2]);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)this,fVar4 / (float)uVar2,
                 fVar5 / (float)(uint)coords[3].m_data[2],(float)slices[(long)samplePosNdx + -2],0.0
                );
      uVar7 = extraout_XMM0_Qa_00;
    }
    else if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
      fVar4 = tcu::Vector<float,_3>::x
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      uVar2 = (ulong)(uint)coords[3].m_data[2];
      fVar5 = tcu::Vector<float,_3>::y
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      uVar3 = (ulong)(uint)coords[3].m_data[2];
      fVar6 = tcu::Vector<float,_3>::z
                        ((Vector<float,_3> *)(coords[(long)samplePosNdx + -1].m_data + 1));
      in_XMM1_Qa = (ulong)(uint)(fVar5 / (float)uVar3);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)this,fVar4 / (float)uVar2,fVar5 / (float)uVar3,
                 fVar6 / (float)(uint)coords[3].m_data[2],0.0);
      uVar7 = extraout_XMM0_Qa_01;
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
      uVar7 = extraout_XMM0_Qa_02;
    }
  }
  else {
    if (viewType != VK_IMAGE_VIEW_TYPE_CUBE) {
      if (viewType - VK_IMAGE_VIEW_TYPE_1D_ARRAY < 2) goto LAB_00a127e3;
      if (viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
        uVar7 = extraout_XMM0_Qa_04;
        goto LAB_00a12da8;
      }
    }
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(slices_1 + 2),0.75,0.5,(float)(uint)coords[3].m_data[2]);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords_1[0].m_data + 1),
               (float)(int)(0xd % (ulong)(uint)coords[3].m_data[2]) + 0.25,0.0,
               (float)(int)(0x10 % (ulong)(uint)coords[3].m_data[2]) + 0.5);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords_1[1].m_data + 1),0.0,
               (float)(int)(0x54 % (ulong)(uint)coords[3].m_data[2]) + 0.5,
               (float)(int)(10 % (ulong)(uint)coords[3].m_data[2]) + 0.75);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(coords_1[2].m_data + 1),(float)(uint)coords[3].m_data[2],
               (float)(int)(0x4b % (ulong)(uint)coords[3].m_data[2]) + 0.25,
               (float)(int)(0x53 % (ulong)(uint)coords[3].m_data[2]) + 0.75);
    local_a8[0] = (uint)(1 % (ulong)(uint)coords[3].m_data[1]);
    local_a8[1] = (uint)(2 % (ulong)(uint)coords[3].m_data[1]);
    slices_1[0] = (deUint32)(9 % (ulong)(uint)coords[3].m_data[1]);
    slices_1[1] = (deUint32)(5 % (ulong)(uint)coords[3].m_data[1]);
    fVar4 = tcu::Vector<float,_3>::x
                      ((Vector<float,_3> *)(coords_1[(long)samplePosNdx + -1].m_data + 1));
    uVar2 = (ulong)(uint)coords[3].m_data[2];
    fVar5 = tcu::Vector<float,_3>::y
                      ((Vector<float,_3> *)(coords_1[(long)samplePosNdx + -1].m_data + 1));
    fVar5 = fVar5 / (float)(uint)coords[3].m_data[2] + fVar5 / (float)(uint)coords[3].m_data[2] +
            -1.0;
    fVar6 = tcu::Vector<float,_3>::z
                      ((Vector<float,_3> *)(coords_1[(long)samplePosNdx + -1].m_data + 1));
    in_XMM1_Qa = (ulong)(uint)fVar5;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)this,fVar4 / (float)uVar2 + fVar4 / (float)uVar2 + -1.0,fVar5,
               fVar6 / (float)(uint)coords[3].m_data[2] + fVar6 / (float)(uint)coords[3].m_data[2] +
               -1.0,(float)local_a8[samplePosNdx]);
    uVar7 = extraout_XMM0_Qa_03;
  }
LAB_00a12da8:
  VVar8.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar8.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar8.m_data[0] = (float)(int)uVar7;
  VVar8.m_data[1] = (float)(int)((ulong)uVar7 >> 0x20);
  return (Vec4)VVar8.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::getSamplePos (vk::VkImageViewType viewType, deUint32 baseMipLevel, deUint32 baseArraySlice, int samplePosNdx)
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	const deUint32	imageSize	= (deUint32)IMAGE_SIZE >> baseMipLevel;
	const deUint32	arraySize	= isImageViewTypeArray(viewType) ? ARRAY_SIZE - baseArraySlice : 1;

	// choose arbitrary values that are not ambiguous with NEAREST filtering

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_3D:
		{
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)(12u % imageSize) + 0.25f),

				tcu::Vec3((float)(23u % imageSize) + 0.25f,
						  (float)(73u % imageSize) + 0.5f,
						  (float)(16u % imageSize) + 0.5f + (float)imageSize),

				tcu::Vec3(-(float)(43u % imageSize) + 0.25f,
						  (float)(84u % imageSize) + 0.5f + (float)imageSize,
						  (float)(117u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize + 0.5f,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.25f + (float)imageSize),
			};
			const deUint32	slices[4]	=
			{
				0u % arraySize,
				4u % arraySize,
				9u % arraySize,
				2u % arraySize,
			};

			if (viewType == vk::VK_IMAGE_VIEW_TYPE_1D || viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f,
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_2D || viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_3D)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 coords[samplePosNdx].z() / (float)imageSize,
								 0.0f);
			else
			{
				DE_FATAL("Impossible");
				return tcu::Vec4();
			}
		}

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			// \note these values are in [0, texSize]*3 space for convenience
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)imageSize),

				tcu::Vec3((float)(13u % imageSize) + 0.25f,
						  0.0f,
						  (float)(16u % imageSize) + 0.5f),

				tcu::Vec3(0.0f,
						  (float)(84u % imageSize) + 0.5f,
						  (float)(10u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.75f),
			};
			const deUint32	slices[4]	=
			{
				1u % arraySize,
				2u % arraySize,
				9u % arraySize,
				5u % arraySize,
			};

			DE_ASSERT(de::inRange(coords[samplePosNdx].x(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].y(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].z(), 0.0f, (float)imageSize));

			// map to [-1, 1]*3 space
			return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].y() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].z() / (float)imageSize * 2.0f - 1.0f,
							 (float)slices[samplePosNdx]);
		}

		default:
			DE_FATAL("Impossible");
			return tcu::Vec4();
	}
}